

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CopyBroadcastReceiver.h
# Opt level: O0

int __thiscall
aeron::concurrent::broadcast::CopyBroadcastReceiver::receive
          (CopyBroadcastReceiver *this,handler_t *handler)

{
  long lVar1;
  bool bVar2;
  int32_t iVar3;
  index_t iVar4;
  long lVar5;
  IllegalArgumentException *this_00;
  char *pcVar6;
  IllegalStateException *pIVar7;
  AtomicBuffer *srcBuffer;
  allocator local_211;
  string local_210;
  allocator local_1e9;
  string local_1e8;
  allocator local_1c1;
  string local_1c0;
  int32_t local_1a0;
  undefined1 local_19a;
  allocator local_199;
  int32_t msgTypeId;
  allocator local_171;
  string local_170;
  string local_150;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  int32_t local_b0;
  undefined1 local_aa;
  allocator local_a9;
  int32_t length;
  allocator local_81;
  string local_80;
  allocator local_49;
  string local_48;
  long local_28;
  long lastSeenLappedCount;
  handler_t *phStack_18;
  int messagesReceived;
  handler_t *handler_local;
  CopyBroadcastReceiver *this_local;
  
  lastSeenLappedCount._4_4_ = 0;
  phStack_18 = handler;
  handler_local = (handler_t *)this;
  local_28 = BroadcastReceiver::lappedCount(this->m_receiver);
  bVar2 = BroadcastReceiver::receiveNext(this->m_receiver);
  lVar1 = local_28;
  if (bVar2) {
    lVar5 = BroadcastReceiver::lappedCount(this->m_receiver);
    if (lVar1 != lVar5) {
      local_aa = 1;
      this_00 = (IllegalArgumentException *)__cxa_allocate_exception(0x48);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_48,"unable to keep up with broadcast buffer",&local_49);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_80,
                 "int aeron::concurrent::broadcast::CopyBroadcastReceiver::receive(const handler_t &)"
                 ,&local_81);
      pcVar6 = util::past_prefix("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                                 ,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O0/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/concurrent/broadcast/CopyBroadcastReceiver.h"
                                );
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&length,pcVar6,&local_a9);
      util::IllegalArgumentException::IllegalArgumentException
                (this_00,&local_48,&local_80,(string *)&length,0x35);
      local_aa = 0;
      __cxa_throw(this_00,&util::IllegalArgumentException::typeinfo,
                  util::IllegalArgumentException::~IllegalArgumentException);
    }
    iVar3 = BroadcastReceiver::length(this->m_receiver);
    local_b0 = iVar3;
    iVar4 = AtomicBuffer::capacity(&this->m_scratchBuffer);
    if (iVar4 < iVar3) {
      local_19a = 1;
      pIVar7 = (IllegalStateException *)__cxa_allocate_exception(0x48);
      std::__cxx11::to_string(&local_130,local_b0);
      std::operator+(&local_110,"buffer required size ",&local_130);
      std::operator+(&local_f0,&local_110," but only has ");
      iVar4 = AtomicBuffer::capacity(&this->m_scratchBuffer);
      std::__cxx11::to_string(&local_150,iVar4);
      std::operator+(&local_d0,&local_f0,&local_150);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_170,
                 "int aeron::concurrent::broadcast::CopyBroadcastReceiver::receive(const handler_t &)"
                 ,&local_171);
      pcVar6 = util::past_prefix("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                                 ,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O0/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/concurrent/broadcast/CopyBroadcastReceiver.h"
                                );
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&msgTypeId,pcVar6,&local_199);
      util::IllegalStateException::IllegalStateException
                (pIVar7,&local_d0,&local_170,(string *)&msgTypeId,0x3d);
      local_19a = 0;
      __cxa_throw(pIVar7,&util::IllegalStateException::typeinfo,
                  util::IllegalStateException::~IllegalStateException);
    }
    local_1a0 = BroadcastReceiver::typeId(this->m_receiver);
    srcBuffer = BroadcastReceiver::buffer(this->m_receiver);
    iVar4 = BroadcastReceiver::offset(this->m_receiver);
    AtomicBuffer::putBytes(&this->m_scratchBuffer,0,srcBuffer,iVar4,local_b0);
    bVar2 = BroadcastReceiver::validate(this->m_receiver);
    if (!bVar2) {
      pIVar7 = (IllegalStateException *)__cxa_allocate_exception(0x48);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_1c0,"unable to keep up with broadcast buffer",&local_1c1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_1e8,
                 "int aeron::concurrent::broadcast::CopyBroadcastReceiver::receive(const handler_t &)"
                 ,&local_1e9);
      pcVar6 = util::past_prefix("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                                 ,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O0/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/concurrent/broadcast/CopyBroadcastReceiver.h"
                                );
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_210,pcVar6,&local_211);
      util::IllegalStateException::IllegalStateException
                (pIVar7,&local_1c0,&local_1e8,&local_210,0x45);
      __cxa_throw(pIVar7,&util::IllegalStateException::typeinfo,
                  util::IllegalStateException::~IllegalStateException);
    }
    std::function<void_(int,_aeron::concurrent::AtomicBuffer_&,_int,_int)>::operator()
              (phStack_18,local_1a0,&this->m_scratchBuffer,0,local_b0);
    lastSeenLappedCount._4_4_ = 1;
  }
  return lastSeenLappedCount._4_4_;
}

Assistant:

int receive(const handler_t& handler)
    {
        int messagesReceived = 0;
        const long lastSeenLappedCount = m_receiver.lappedCount();

        if (m_receiver.receiveNext())
        {
            if (lastSeenLappedCount != m_receiver.lappedCount())
            {
                throw util::IllegalArgumentException("unable to keep up with broadcast buffer", SOURCEINFO);
            }

            const std::int32_t length = m_receiver.length();
            if (length > m_scratchBuffer.capacity())
            {
                throw util::IllegalStateException(
                    "buffer required size " + std::to_string(length) +
                    " but only has " + std::to_string(m_scratchBuffer.capacity()), SOURCEINFO);
            }

            const std::int32_t msgTypeId = m_receiver.typeId();
            m_scratchBuffer.putBytes(0, m_receiver.buffer(), m_receiver.offset(), length);

            if (!m_receiver.validate())
            {
                throw util::IllegalStateException("unable to keep up with broadcast buffer", SOURCEINFO);
            }

            handler(msgTypeId, m_scratchBuffer, 0, length);

            messagesReceived = 1;
        }

        return messagesReceived;
    }